

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

int __thiscall
Refal2::
CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::AddKey(CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  CKeyDataPair *pCVar1;
  pointer ppVar2;
  long lVar3;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_int>_>::value,_pair<iterator,_bool>_>
  _Var4;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_80;
  int local_74;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  _Stack_70;
  int result;
  undefined1 local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_50;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_28;
  CPair insert;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  insert._8_8_ = key;
  std::make_pair<std::__cxx11::string_const&,int&>(&local_50,key,&this->size);
  _Var4 = std::
          map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::insert<std::pair<std::__cxx11::string,int>>
                    ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&this->keyToIndex,&local_50);
  _Stack_70 = _Var4.first._M_node;
  local_68 = _Var4.second;
  local_28._M_node = _Stack_70._M_node;
  insert.first._M_node._0_1_ = local_68;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_50);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           ::operator->(&local_28);
  local_74 = ppVar2->second;
  if (((byte)insert.first._M_node & 1) != 0) {
    this->size = this->size + 1;
    if (this->capacity < this->size) {
      grow(this,this->capacity << 1);
    }
    pCVar1 = this->keyDataPairs;
    lVar3 = (long)local_74;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::_Rb_tree_const_iterator(&local_80,&local_28);
    CKeyDataPair::CKeyDataPair(pCVar1 + lVar3,&local_80);
  }
  return local_74;
}

Assistant:

int CDictionary<Data, Key>::AddKey( const Key& key )
{
	typedef std::pair<typename CKeyToIndex::iterator, bool> CPair;
	CPair insert = keyToIndex.insert( std::make_pair( key, size ) );
	const int result = insert.first->second;
	if( insert.second ) {
		size++;
		if( capacity < size ) {
			grow( capacity * 2 );
		}
		new( keyDataPairs + result )CKeyDataPair( insert.first );
	}
	return result;
}